

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmMakefileTargetGenerator::WriteObjectsStrings
          (cmMakefileTargetGenerator *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *objStrings,size_type limit)

{
  cmMakefile *this_00;
  cmLocalUnixMakefileGenerator3 *this_01;
  pointer pbVar1;
  cmGeneratorTarget *this_02;
  bool bVar2;
  cmValue suffix;
  string *obj_2;
  pointer pbVar3;
  string *obj;
  string *obj_1;
  string_view str;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ispcAdditionalObjs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f0;
  string local_d8;
  cmMakefileTargetGeneratorObjectStrings local_b8;
  
  this_00 = (this->super_cmCommonTargetGenerator).Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,"CMAKE_PCH_EXTENSION",(allocator<char> *)&local_d8);
  suffix = cmMakefile::GetDefinition(this_00,(string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  this_01 = this->LocalGenerator;
  local_b8.OutputConverter =
       &(this_01->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter;
  if (this_01 == (cmLocalUnixMakefileGenerator3 *)0x0) {
    local_b8.OutputConverter = (cmOutputConverter *)0x0;
  }
  cmLocalGenerator::GetStateSnapshot((cmStateSnapshot *)&local_d8,(cmLocalGenerator *)this_01);
  cmStateSnapshot::GetDirectory(&local_b8.StateDir,(cmStateSnapshot *)&local_d8);
  local_b8.CurrentString._M_dataplus._M_p = (pointer)&local_b8.CurrentString.field_2;
  local_b8.CurrentString._M_string_length = 0;
  local_b8.CurrentString.field_2._M_local_buf[0] = '\0';
  local_b8.NextObject._M_dataplus._M_p = (pointer)&local_b8.NextObject.field_2;
  local_b8.NextObject._M_string_length = 0;
  local_b8.NextObject.field_2._M_local_buf[0] = '\0';
  local_b8.Space = "";
  pbVar1 = (this->Objects).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_b8.Strings = objStrings;
  local_b8.LengthLimit = limit;
  for (pbVar3 = (this->Objects).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pbVar3 != pbVar1; pbVar3 = pbVar3 + 1) {
    str._M_str = (pbVar3->_M_dataplus)._M_p;
    str._M_len = pbVar3->_M_string_length;
    bVar2 = cmHasSuffix(str,suffix);
    if (!bVar2) {
      cmMakefileTargetGeneratorObjectStrings::Feed(&local_b8,pbVar3);
    }
  }
  pbVar1 = (this->ExternalObjects).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar3 = (this->ExternalObjects).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pbVar3 != pbVar1; pbVar3 = pbVar3 + 1) {
    cmMakefileTargetGeneratorObjectStrings::Feed(&local_b8,pbVar3);
  }
  this_02 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
  GetConfigName_abi_cxx11_(&local_d8,this);
  cmGeneratorTarget::GetGeneratedISPCObjects(&local_f0,this_02,&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  for (pbVar3 = local_f0.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pbVar3 != local_f0.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; pbVar3 = pbVar3 + 1) {
    cmMakefileTargetGeneratorObjectStrings::Feed(&local_b8,pbVar3);
  }
  cmMakefileTargetGeneratorObjectStrings::Done(&local_b8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_f0);
  cmMakefileTargetGeneratorObjectStrings::~cmMakefileTargetGeneratorObjectStrings(&local_b8);
  return;
}

Assistant:

void cmMakefileTargetGenerator::WriteObjectsStrings(
  std::vector<std::string>& objStrings, std::string::size_type limit)
{
  cmValue pchExtension = this->Makefile->GetDefinition("CMAKE_PCH_EXTENSION");

  cmMakefileTargetGeneratorObjectStrings helper(
    objStrings, this->LocalGenerator,
    this->LocalGenerator->GetStateSnapshot().GetDirectory(), limit);
  for (std::string const& obj : this->Objects) {
    if (cmHasSuffix(obj, pchExtension)) {
      continue;
    }
    helper.Feed(obj);
  }
  for (std::string const& obj : this->ExternalObjects) {
    helper.Feed(obj);
  }
  auto ispcAdditionalObjs =
    this->GeneratorTarget->GetGeneratedISPCObjects(this->GetConfigName());
  for (std::string const& obj : ispcAdditionalObjs) {
    helper.Feed(obj);
  }
  helper.Done();
}